

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_gen.c
# Opt level: O0

iogen_oprnd * gen_size_conversion(dill_stream c,iogen_oprnd src_oprnd,int size)

{
  int iVar1;
  int in_EDX;
  long *in_RSI;
  iogen_oprnd *in_RDI;
  undefined4 in_stack_00000008;
  undefined4 in_stack_0000000c;
  int iStack0000000000000010;
  size_t in_stack_00000018;
  undefined4 uStack0000000000000020;
  undefined4 uStack0000000000000024;
  undefined4 uStack0000000000000028;
  undefined4 uStack000000000000002c;
  dill_reg at;
  int in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int local_10;
  
  in_RDI->vc_reg = uStack0000000000000028;
  in_RDI->vc_reg2 = uStack000000000000002c;
  in_RDI->offset = in_stack_00000018;
  in_RDI->aligned = uStack0000000000000020;
  in_RDI->byte_swap = uStack0000000000000024;
  in_RDI->address = in_stack_00000008;
  in_RDI->data_type = in_stack_0000000c;
  *(undefined8 *)&in_RDI->size = _iStack0000000000000010;
  in_RDI->size = in_EDX;
  switch(in_stack_0000000c) {
  case 0:
  default:
    break;
  case 1:
    switch(in_EDX) {
    case 1:
      iVar1 = ffs_getreg((void *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                         (int *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                         in_stack_ffffffffffffff94,in_stack_ffffffffffffff90);
      if (iVar1 == 0) {
        fprintf(_stderr,"%s\n","gen size convert out of registers \n");
        exit(0);
      }
      if (iStack0000000000000010 == 2) {
        (**(code **)(*in_RSI + 0xa8))(in_RSI,2,6,in_RDI->vc_reg,uStack0000000000000028);
        (**(code **)(*in_RSI + 0xa8))(in_RSI,6,0,in_RDI->vc_reg,uStack0000000000000028);
      }
      else if (iStack0000000000000010 == 4) {
        (**(code **)(*in_RSI + 0xa8))(in_RSI,4,0,in_RDI->vc_reg,uStack0000000000000028);
      }
      else if (iStack0000000000000010 == 8) {
        (**(code **)(*in_RSI + 0xa8))(in_RSI,6,0,in_RDI->vc_reg,uStack0000000000000028);
      }
      break;
    case 2:
      iVar1 = ffs_getreg((void *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                         (int *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                         in_stack_ffffffffffffff94,in_stack_ffffffffffffff90);
      if (iVar1 == 0) {
        fprintf(_stderr,"%s\n","gen size convert out of registers \n");
        exit(0);
      }
      if (iStack0000000000000010 == 1) {
        iVar1 = ffs_getreg((void *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                           (int *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                           in_stack_ffffffffffffff94,in_stack_ffffffffffffff90);
        if (iVar1 == 0) {
          fprintf(_stderr,"%s\n","gen type convert2 out of registers \n");
          exit(0);
        }
        (**(code **)(*in_RSI + 0xa8))(in_RSI,0,6,local_10,uStack0000000000000028);
        (**(code **)(*in_RSI + 0xa8))(in_RSI,6,2,in_RDI->vc_reg,local_10);
        ffs_putreg(in_RSI,local_10,6);
      }
      else if (iStack0000000000000010 == 4) {
        (**(code **)(*in_RSI + 0xa8))(in_RSI,4,2,in_RDI->vc_reg,uStack0000000000000028);
      }
      else if (iStack0000000000000010 == 8) {
        (**(code **)(*in_RSI + 0xa8))(in_RSI,6,2,in_RDI->vc_reg,uStack0000000000000028);
      }
      break;
    case 4:
      iVar1 = ffs_getreg((void *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                         (int *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                         in_stack_ffffffffffffff94,in_stack_ffffffffffffff90);
      if (iVar1 == 0) {
        fprintf(_stderr,"%s\n","gen size convert out of registers E\n");
        exit(0);
      }
      if (iStack0000000000000010 == 1) {
        (**(code **)(*in_RSI + 0xa8))(in_RSI,0,4,in_RDI->vc_reg,uStack0000000000000028);
      }
      else if (iStack0000000000000010 == 2) {
        (**(code **)(*in_RSI + 0xa8))(in_RSI,2,4,in_RDI->vc_reg,uStack0000000000000028);
      }
      else if (iStack0000000000000010 == 8) {
        (**(code **)(*in_RSI + 0xa8))(in_RSI,6,4,in_RDI->vc_reg,uStack0000000000000028);
      }
      break;
    case 8:
      iVar1 = ffs_getreg((void *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                         (int *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                         in_stack_ffffffffffffff94,in_stack_ffffffffffffff90);
      if (iVar1 == 0) {
        fprintf(_stderr,"%s\n","gen size convert out of registers \n");
        exit(0);
      }
      if (iStack0000000000000010 == 1) {
        (**(code **)(*in_RSI + 0xa8))(in_RSI,0,6,in_RDI->vc_reg,uStack0000000000000028);
      }
      else if (iStack0000000000000010 == 2) {
        (**(code **)(*in_RSI + 0xa8))(in_RSI,2,6,in_RDI->vc_reg,uStack0000000000000028);
      }
      else if (iStack0000000000000010 == 4) {
        (**(code **)(*in_RSI + 0xa8))(in_RSI,4,6,in_RDI->vc_reg,uStack0000000000000028);
      }
    }
    break;
  case 2:
  case 4:
  case 6:
  case 7:
    switch(in_EDX) {
    case 1:
      iVar1 = ffs_getreg((void *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                         (int *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                         in_stack_ffffffffffffff94,in_stack_ffffffffffffff90);
      if (iVar1 == 0) {
        fprintf(_stderr,"%s\n","gen size convert out of registers \n");
        exit(0);
      }
      if (iStack0000000000000010 == 2) {
        (**(code **)(*in_RSI + 0xa8))(in_RSI,2,6,in_RDI->vc_reg,uStack0000000000000028);
        (**(code **)(*in_RSI + 0xa8))(in_RSI,6,0,in_RDI->vc_reg,uStack0000000000000028);
      }
      else if (iStack0000000000000010 == 4) {
        (**(code **)(*in_RSI + 0xa8))(in_RSI,4,6,in_RDI->vc_reg,uStack0000000000000028);
        (**(code **)(*in_RSI + 0xa8))(in_RSI,6,0,in_RDI->vc_reg,uStack0000000000000028);
      }
      else if (iStack0000000000000010 == 8) {
        (**(code **)(*in_RSI + 0xa8))(in_RSI,6,0,in_RDI->vc_reg,uStack0000000000000028);
      }
      break;
    case 2:
      iVar1 = ffs_getreg((void *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                         (int *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                         in_stack_ffffffffffffff94,in_stack_ffffffffffffff90);
      if (iVar1 == 0) {
        fprintf(_stderr,"%s\n","gen size convert out of registers \n");
        exit(0);
      }
      if (iStack0000000000000010 == 1) {
        iVar1 = ffs_getreg((void *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                           (int *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                           in_stack_ffffffffffffff94,in_stack_ffffffffffffff90);
        if (iVar1 == 0) {
          fprintf(_stderr,"%s\n","gen type convert2 out of registers \n");
          exit(0);
        }
        (**(code **)(*in_RSI + 0xa8))(in_RSI,0,6,local_10,uStack0000000000000028);
        (**(code **)(*in_RSI + 0xa8))(in_RSI,6,2,in_RDI->vc_reg,local_10);
        ffs_putreg(in_RSI,local_10,6);
      }
      else if (iStack0000000000000010 == 4) {
        (**(code **)(*in_RSI + 0xa8))(in_RSI,4,2,in_RDI->vc_reg,uStack0000000000000028);
      }
      else if (iStack0000000000000010 == 8) {
        (**(code **)(*in_RSI + 0xa8))(in_RSI,6,2,in_RDI->vc_reg,uStack0000000000000028);
      }
      break;
    case 4:
      iVar1 = ffs_getreg((void *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                         (int *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                         in_stack_ffffffffffffff94,in_stack_ffffffffffffff90);
      if (iVar1 == 0) {
        fprintf(_stderr,"%s\n","gen size convert out of registers \n");
        exit(0);
      }
      if (iStack0000000000000010 == 1) {
        (**(code **)(*in_RSI + 0xa8))(in_RSI,0,5,in_RDI->vc_reg,uStack0000000000000028);
      }
      else if (iStack0000000000000010 == 2) {
        (**(code **)(*in_RSI + 0xa8))(in_RSI,2,5,in_RDI->vc_reg,uStack0000000000000028);
      }
      else if (iStack0000000000000010 == 8) {
        (**(code **)(*in_RSI + 0xa8))(in_RSI,6,5,in_RDI->vc_reg,uStack0000000000000028);
      }
      break;
    case 8:
      iVar1 = ffs_getreg((void *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                         (int *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                         in_stack_ffffffffffffff94,in_stack_ffffffffffffff90);
      if (iVar1 == 0) {
        fprintf(_stderr,"%s\n","gen size convert out of registers \n");
        exit(0);
      }
      if (iStack0000000000000010 == 1) {
        (**(code **)(*in_RSI + 0xa8))(in_RSI,1,7,in_RDI->vc_reg,uStack0000000000000028);
      }
      else if (iStack0000000000000010 == 2) {
        (**(code **)(*in_RSI + 0xa8))(in_RSI,3,7,in_RDI->vc_reg,uStack0000000000000028);
      }
      else if (iStack0000000000000010 == 4) {
        (**(code **)(*in_RSI + 0xa8))(in_RSI,5,7,in_RDI->vc_reg,uStack0000000000000028);
      }
    }
    break;
  case 3:
    if (in_EDX == 4) {
      iVar1 = ffs_getreg((void *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                         (int *)CONCAT44(4,in_stack_ffffffffffffff98),in_stack_ffffffffffffff94,
                         in_stack_ffffffffffffff90);
      if (iVar1 == 0) {
        fprintf(_stderr,"%s\n","gen size convert out of registers \n");
        exit(0);
      }
      if ((iStack0000000000000010 != 4) && (iStack0000000000000010 == 8)) {
        (**(code **)(*in_RSI + 0xa8))(in_RSI,10,9,in_RDI->vc_reg,uStack0000000000000028);
      }
    }
    else if (in_EDX == 8) {
      iVar1 = ffs_getreg((void *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                         (int *)CONCAT44(8,in_stack_ffffffffffffff98),in_stack_ffffffffffffff94,
                         in_stack_ffffffffffffff90);
      if (iVar1 == 0) {
        fprintf(_stderr,"%s\n","gen size convert out of registers \n");
        exit(0);
      }
      if (iStack0000000000000010 == 4) {
        (**(code **)(*in_RSI + 0xa8))(in_RSI,9,10,in_RDI->vc_reg,uStack0000000000000028);
      }
    }
    else {
      iVar1 = ffs_getreg((void *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                         (int *)CONCAT44(in_EDX,in_stack_ffffffffffffff98),in_stack_ffffffffffffff94
                         ,in_stack_ffffffffffffff90);
      if (iVar1 == 0) {
        fprintf(_stderr,"%s\n","gen size convert out of registers \n");
        exit(0);
      }
      if (iStack0000000000000010 == 4) {
        (**(code **)(*in_RSI + 0xa8))(in_RSI,9,10,in_RDI->vc_reg,uStack0000000000000028);
      }
    }
  }
  return in_RDI;
}

Assistant:

iogen_oprnd
gen_size_conversion(dill_stream c, iogen_oprnd src_oprnd, int size)
{
    iogen_oprnd result_oprnd = src_oprnd;
    dill_reg at;  /* temporary */
    result_oprnd.size = size;
    switch (src_oprnd.data_type) {
    case integer_type:
	switch (size) {
	case 1:
	    if (!ffs_getreg(c, &result_oprnd.vc_reg, DILL_C, DILL_TEMP))
		gen_fatal("gen size convert out of registers \n");
	    REG_DEBUG(("get %d in size convert\n", _vrr(result_oprnd.vc_reg)));
	    switch (src_oprnd.size) {
	    case 2:
		dill_cvs2l(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		dill_cvl2c(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    case 4:
		dill_cvi2c(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    case 8:
		dill_cvl2c(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    }
	    break;
	case 2:
	    if (!ffs_getreg(c, &result_oprnd.vc_reg, DILL_S, DILL_TEMP))
		gen_fatal("gen size convert out of registers \n");
	    REG_DEBUG(("get %d in size convert\n", _vrr(result_oprnd.vc_reg)));
	    switch (src_oprnd.size) {
	    case 1:
		if (!ffs_getreg(c, &at, DILL_L, DILL_TEMP))
		    gen_fatal("gen type convert2 out of registers \n");
		dill_cvc2l(c, at, src_oprnd.vc_reg);
		dill_cvl2s(c, result_oprnd.vc_reg, at);
		ffs_putreg(c, at, DILL_L);
		break;
	    case 4:
		dill_cvi2s(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    case 8:
		dill_cvl2s(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    }
	    break;
	case 4:
	    if (!ffs_getreg(c, &result_oprnd.vc_reg, DILL_I, DILL_TEMP))
		gen_fatal("gen size convert out of registers E\n");
	    REG_DEBUG(("get %d in size convert\n", _vrr(result_oprnd.vc_reg)));
	    switch (src_oprnd.size) {
	    case 1:
		dill_cvc2i(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    case 2:
		dill_cvs2i(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    case 8:
		dill_cvl2i(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    }
	    break;
	case 8:
#if SIZEOF_SIZE_T == 8
	    if (!ffs_getreg(c, &result_oprnd.vc_reg, DILL_L, DILL_TEMP))
		gen_fatal("gen size convert out of registers \n");
	    REG_DEBUG(("get %d in size convert\n", _vrr(result_oprnd.vc_reg)));
	    switch (src_oprnd.size) {
	    case 1:
		dill_cvc2l(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    case 2:
		dill_cvs2l(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    case 4:
		dill_cvi2l(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    }
	    break;
#else
	    if (!ffs_getreg(c, &result_oprnd.vc_reg, DILL_L, DILL_TEMP) ||
		(!ffs_getreg(c, &result_oprnd.vc_reg2, DILL_L, DILL_TEMP)))
		gen_fatal("gen size convert out of registers \n");
	    REG_DEBUG(("get %d in size convert\n", _vrr(result_oprnd.vc_reg)));
	    REG_DEBUG(("get %d in size convert\n", _vrr(result_oprnd.vc_reg2)));
	    dill_setl(c, result_oprnd.vc_reg2, 0);
	    switch (src_oprnd.size) {
	    case 1:
		dill_cvc2l(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    case 2:
		dill_cvs2l(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    case 4:
		dill_cvi2l(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    }
	    break;
#endif
	}
	break;
    case boolean_type:
    case enumeration_type:
    case unsigned_type:
    case char_type:
	switch (size) {
	case 1:
	    if (!ffs_getreg(c, &result_oprnd.vc_reg, DILL_UC, DILL_TEMP))
		gen_fatal("gen size convert out of registers \n");
	    REG_DEBUG(("get %d in size convert\n", _vrr(result_oprnd.vc_reg)));
	    switch (src_oprnd.size) {
	    case 2:
		dill_cvs2l(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		dill_cvl2c(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    case 4:
		dill_cvi2l(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		dill_cvl2c(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    case 8:
		dill_cvl2c(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    }
	    break;
	case 2:
	    if (!ffs_getreg(c, &result_oprnd.vc_reg, DILL_US, DILL_TEMP))
		gen_fatal("gen size convert out of registers \n");
	    REG_DEBUG(("get %d in size convert\n", _vrr(result_oprnd.vc_reg)));
	    switch (src_oprnd.size) {
	    case 1:
		if (!ffs_getreg(c, &at, DILL_L, DILL_TEMP))
		    gen_fatal("gen type convert2 out of registers \n");
		dill_cvc2l(c, at, src_oprnd.vc_reg);
		dill_cvl2s(c, result_oprnd.vc_reg, at);
		ffs_putreg(c, at, DILL_L);
		break;
	    case 4:
		dill_cvi2s(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    case 8:
		dill_cvl2s(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    }
	    break;
	case 4:
	    if (!ffs_getreg(c, &result_oprnd.vc_reg, DILL_U, DILL_TEMP))
		gen_fatal("gen size convert out of registers \n");
	    REG_DEBUG(("get %d in size convert\n", _vrr(result_oprnd.vc_reg)));
	    switch (src_oprnd.size) {
	    case 1:
		dill_cvc2u(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    case 2:
		dill_cvs2u(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    case 8:
		dill_cvl2u(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    }
	    break;
	case 8:
#if SIZEOF_SIZE_T == 8
	    if (!ffs_getreg(c, &result_oprnd.vc_reg, DILL_UL, DILL_TEMP))
		gen_fatal("gen size convert out of registers \n");
	    REG_DEBUG(("get %d in size convert\n", _vrr(result_oprnd.vc_reg)));
	    switch (src_oprnd.size) {
	    case 1:
		dill_cvuc2ul(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    case 2:
		dill_cvus2ul(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    case 4:
		dill_cvu2ul(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    }
	    break;
#else
	    if (!ffs_getreg(c, &result_oprnd.vc_reg, DILL_UL, DILL_TEMP) ||
		!ffs_getreg(c, &result_oprnd.vc_reg2, DILL_UL, DILL_TEMP))
		gen_fatal("gen size convert out of registers \n");
	    REG_DEBUG(("get %d in size convert\n", _vrr(result_oprnd.vc_reg)));
	    REG_DEBUG(("get %d in size convert\n", _vrr(result_oprnd.vc_reg2)));
	    dill_setl(c, result_oprnd.vc_reg2, 0);
	    switch (src_oprnd.size) {
	    case 1:
		dill_cvc2ul(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    case 2:
		dill_cvs2ul(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    case 4:
		dill_cvi2ul(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    }
	    break;
#endif
	}
	break;
    case float_type:
	switch (size) {
	case SIZEOF_FLOAT:
	    if (!ffs_getreg(c, &result_oprnd.vc_reg, DILL_F, DILL_TEMP))
		gen_fatal("gen size convert out of registers \n");
	    REG_DEBUG(("get %d in size convert\n", _vrr(result_oprnd.vc_reg)));
	    switch (src_oprnd.size) {
	    case SIZEOF_FLOAT:
		assert(FALSE);
		break;
	    case SIZEOF_DOUBLE:
		dill_cvd2f(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    default:
		assert(FALSE);
	    }
	    break;
	case SIZEOF_DOUBLE:
	    if (!ffs_getreg(c, &result_oprnd.vc_reg, DILL_D, DILL_TEMP))
		gen_fatal("gen size convert out of registers \n");
	    REG_DEBUG(("get %d in size convert\n", _vrr(result_oprnd.vc_reg)));
	    REG_DEBUG(("get %d in size convert\n", _vrr(result_oprnd.vc_reg)));
	    switch (src_oprnd.size) {
	    case SIZEOF_DOUBLE:
		assert(FALSE);
		break;
	    case SIZEOF_FLOAT:
		dill_cvf2d(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    default:
		assert(FALSE);
	    }
	    break;
	default:
	    /* really should fail */
	    if (!ffs_getreg(c, &result_oprnd.vc_reg, DILL_D, DILL_TEMP))
		gen_fatal("gen size convert out of registers \n");
	    REG_DEBUG(("get %d in size convert\n", _vrr(result_oprnd.vc_reg)));
	    REG_DEBUG(("get %d in size convert\n", _vrr(result_oprnd.vc_reg)));
	    switch (src_oprnd.size) {
	    case SIZEOF_DOUBLE:
/*		assert(FALSE);*/
		break;
	    case SIZEOF_FLOAT:
		dill_cvf2d(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    default:
		assert(FALSE);
	    }
	    break;
	    
	}
	break;
    case unknown_type:
    default:
	assert(FALSE);
	break;
    }
    return result_oprnd;
}